

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConstraintBlockSyntax *pCVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::ConstraintItemSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::ConstraintItemSyntax>(in_stack_00000070,in_stack_00000068);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConstraintBlockSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConstraintItemSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (Token *)TVar3.info);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConstraintBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConstraintBlockSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.closeBrace.deepClone(alloc)
    );
}